

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void __thiscall ICM::Compiler::IdentifierAnalysis::start(IdentifierAnalysis *this)

{
  Node *node;
  IdentifierAnalysis *this_local;
  
  if ((PrintCompilingProcess & 1) != 0) {
    println<char[19]>((char (*) [19])"IdentifierAnalysis");
  }
  node = AnalysisBase::GetNode(&this->super_AnalysisBase,1);
  setIdentSub(this,node);
  if ((PrintCompilingProcess & 1) != 0) {
    println<char[4]>((char (*) [4])"-->");
    AnalysisBase::printTable(&this->super_AnalysisBase);
  }
  return;
}

Assistant:

void start() {
				if (PrintCompilingProcess)
					println("IdentifierAnalysis");

				setIdentSub(GetNode(1));

				if (PrintCompilingProcess) {
					println("-->");
					printTable();
				}
			}